

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

_Bool bitset_container_select
                (bitset_container_t *container,uint32_t *start_rank,uint32_t rank,uint32_t *element)

{
  uint64_t *puVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = *start_rank;
  uVar3 = container->cardinality + uVar5;
  if (uVar3 <= rank) {
    *start_rank = uVar3;
LAB_00117a47:
    return rank < uVar3;
  }
  puVar1 = container->words;
  lVar4 = 0;
  do {
    uVar8 = puVar1[lVar4];
    uVar7 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
    uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
    uVar6 = (byte)(((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) + uVar5;
    if (uVar6 < rank) {
      *start_rank = uVar6;
      uVar5 = uVar6;
    }
    else {
      for (; uVar8 != 0; uVar8 = uVar8 & uVar8 - 1) {
        if (rank == uVar5) {
          lVar2 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          *element = (uint)lVar2 | (int)lVar4 << 6;
          goto LAB_00117a47;
        }
        uVar5 = uVar5 + 1;
        *start_rank = uVar5;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

bool bitset_container_select(const bitset_container_t *container, uint32_t *start_rank, uint32_t rank, uint32_t *element) {
    int card = bitset_container_cardinality(container);
    if(rank >= *start_rank + card) {
        *start_rank += card;
        return false;
    }
    const uint64_t *words = container->words;
    int32_t size;
    for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; i += 1) {
        size = roaring_hamming(words[i]);
        if(rank <= *start_rank + size) {
            uint64_t w = container->words[i];
            uint16_t base = i*64;
            while (w != 0) {
                uint64_t t = w & (~w + 1);
                int r = roaring_trailing_zeroes(w);
                if(*start_rank == rank) {
                    *element = r+base;
                    return true;
                }
                w ^= t;
                *start_rank += 1;
            }
        }
        else
            *start_rank += size;
    }
    assert(false);
    roaring_unreachable;
}